

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

void __thiscall
capnp::InputStreamMessageReader::InputStreamMessageReader
          (InputStreamMessageReader *this,InputStream *inputStream,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  Array<kj::ArrayPtr<const_capnp::word>_> *pAVar1;
  byte **ppbVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  ArrayPtr<const_capnp::word> *pAVar5;
  undefined1 auVar6 [8];
  WireValue<uint32_t>_conflict *pWVar7;
  ssize_t sVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  word *pwVar14;
  word *pwVar15;
  char *pcVar16;
  uint uVar17;
  ReaderOptions options_00;
  uint segmentCount;
  undefined1 local_100 [8];
  Fault f;
  Array<capnp::_::DirectWireValue<unsigned_int>_> moreSizes_heap;
  WireValue<uint32_t>_conflict firstWord [2];
  Fault f_1;
  ReaderOptions options_local;
  WireValue<uint32_t>_conflict moreSizes_stack [16];
  
  pwVar15 = scratchSpace.ptr;
  pcVar10 = (char *)options.traversalLimitInWords;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_006ff6d8;
  this->inputStream = inputStream;
  pAVar1 = &this->moreSegments;
  this->readPos = (byte *)0x0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  (this->ownedSpace).ptr = (word *)0x0;
  (this->ownedSpace).size_ = 0;
  (this->ownedSpace).disposer = (ArrayDisposer *)0x0;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  kj::InputStream::read(inputStream,(int)firstWord,&DAT_00000008,8);
  pcVar16 = (char *)0x0;
  segmentCount = firstWord[0].value + 1;
  moreSizes_stack._0_8_ = &segmentCount;
  if (segmentCount != 0) {
    pcVar16 = (char *)(ulong)firstWord[1].value;
  }
  moreSizes_stack[2].value = 0x200;
  moreSizes_stack._16_8_ = anon_var_dwarf_393616;
  moreSizes_stack[6].value = 4;
  moreSizes_stack[7].value = 0;
  moreSizes_stack[8].value._0_1_ = segmentCount < 0x200;
  local_100 = (undefined1  [8])pcVar16;
  if (!(bool)(undefined1)moreSizes_stack[8].value) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[31]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xb5,FAILED,"segmentCount < 512","_kjCondition,\"Message has too many segments.\"",
               (DebugComparison<unsigned_int_&,_int> *)moreSizes_stack,
               (char (*) [31])"Message has too many segments.");
    segmentCount = 1;
    kj::_::Debug::Fault::~Fault(&f);
    pcVar16 = (char *)0x1;
  }
  uVar17 = segmentCount & 0xfffffffe;
  uVar11 = (ulong)uVar17;
  if (uVar17 < 0x11) {
    moreSizes_heap.ptr = (DirectWireValue<unsigned_int> *)0x0;
    moreSizes_heap.size_ = 0;
    moreSizes_heap.disposer = (ArrayDisposer *)0x0;
    pWVar7 = moreSizes_stack;
  }
  else {
    pWVar7 = (WireValue<uint32_t>_conflict *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (4,uVar11,uVar11,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    moreSizes_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    moreSizes_heap.size_ = uVar11;
    moreSizes_heap.ptr = pWVar7;
  }
  if (1 < segmentCount) {
    if (0x10 < uVar17) {
      uVar11 = moreSizes_heap.size_;
    }
    kj::InputStream::read(inputStream,(int)pWVar7,(void *)(uVar11 << 2),(size_t)(uVar11 << 2));
    if (segmentCount - 1 != 0) {
      uVar11 = 0;
      do {
        local_100 = (undefined1  [8])((long)local_100 + (ulong)pWVar7[uVar11].value);
        uVar11 = uVar11 + 1;
      } while (segmentCount - 1 != uVar11);
    }
  }
  f.exception = (Exception *)local_100;
  if (pcVar10 < (ulong)local_100) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[93]>
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xc9,FAILED,"totalWords <= options.traversalLimitInWords",
               "_kjCondition,\"Message is too large.  To increase the limit on the receiving end, see \" \"capnp::ReaderOptions.\""
               ,(DebugComparison<unsigned_long_&,_unsigned_long_&> *)&f,
               (char (*) [93])
               "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions."
              );
    segmentCount = 1;
    if (pcVar10 < pcVar16) {
      pcVar16 = pcVar10;
    }
    local_100 = (undefined1  [8])pcVar16;
    kj::_::Debug::Fault::~Fault(&f_1);
  }
  auVar6 = local_100;
  if ((char *)scratchSpace.size_ < (ulong)local_100) {
    f.exception = (Exception *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (8,(size_t)local_100,(size_t)local_100,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
    pwVar15 = (this->ownedSpace).ptr;
    if (pwVar15 != (word *)0x0) {
      sVar3 = (this->ownedSpace).size_;
      (this->ownedSpace).ptr = (word *)0x0;
      (this->ownedSpace).size_ = 0;
      pAVar4 = (this->ownedSpace).disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pwVar15,8,sVar3,sVar3,0);
    }
    (this->ownedSpace).ptr = (word *)f.exception;
    (this->ownedSpace).size_ = (size_t)auVar6;
    (this->ownedSpace).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    pwVar15 = (this->ownedSpace).ptr;
  }
  uVar11 = (ulong)pcVar16 & 0xffffffff;
  (this->segment0).ptr = pwVar15;
  (this->segment0).size_ = uVar11;
  if (1 < segmentCount) {
    uVar12 = (ulong)(segmentCount - 1);
    f.exception = (Exception *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0x10,uVar12,uVar12,
                             kj::_::HeapArrayDisposer::Allocate_<kj::ArrayPtr<const_capnp::word>_>::
                             construct,
                             kj::ArrayDisposer::Dispose_<kj::ArrayPtr<const_capnp::word>_>::destruct
                            );
    pAVar5 = pAVar1->ptr;
    if (pAVar5 != (ArrayPtr<const_capnp::word> *)0x0) {
      sVar3 = (this->moreSegments).size_;
      pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
      (this->moreSegments).size_ = 0;
      pAVar4 = (this->moreSegments).disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pAVar5,0x10,sVar3,sVar3,0);
    }
    (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)f.exception;
    (this->moreSegments).size_ = uVar12;
    (this->moreSegments).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    if (segmentCount - 1 != 0) {
      lVar9 = 0;
      uVar12 = uVar11;
      do {
        uVar13 = (ulong)*(uint *)((long)&pWVar7->value + lVar9);
        pwVar14 = pwVar15 + uVar12;
        uVar12 = uVar12 + uVar13;
        pAVar5 = pAVar1->ptr;
        *(word **)((long)&pAVar5->ptr + lVar9 * 4) = pwVar14;
        *(ulong *)((long)&pAVar5->size_ + lVar9 * 4) = uVar13;
        lVar9 = lVar9 + 4;
      } while ((ulong)(segmentCount - 1) << 2 != lVar9);
    }
  }
  if (segmentCount != 0) {
    if (segmentCount == 1) {
      kj::InputStream::read
                (inputStream,(int)pwVar15,(void *)((long)local_100 << 3),
                 (size_t)((long)local_100 << 3));
    }
    else {
      ppbVar2 = &this->readPos;
      *ppbVar2 = (byte *)pwVar15;
      sVar8 = kj::InputStream::read
                        (inputStream,(int)pwVar15,(void *)((long)local_100 << 3),uVar11 << 3);
      *ppbVar2 = *ppbVar2 + sVar8;
    }
  }
  if (moreSizes_heap.ptr != (WireValue<uint32_t>_conflict *)0x0) {
    (**(moreSizes_heap.disposer)->_vptr_ArrayDisposer)
              (moreSizes_heap.disposer,moreSizes_heap.ptr,4,moreSizes_heap.size_,
               moreSizes_heap.size_,0);
  }
  return;
}

Assistant:

InputStreamMessageReader::InputStreamMessageReader(
    kj::InputStream& inputStream, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : MessageReader(options), inputStream(inputStream), readPos(nullptr) {
  _::WireValue<uint32_t> firstWord[2];

  inputStream.read(kj::arrayPtr(firstWord).asBytes());

  uint segmentCount = firstWord[0].get() + 1;
  uint segment0Size = segmentCount == 0 ? 0 : firstWord[1].get();

  size_t totalWords = segment0Size;

  // Reject messages with too many segments for security reasons.
  KJ_REQUIRE(segmentCount < 512, "Message has too many segments.") {
    segmentCount = 1;
    segment0Size = 1;
    break;
  }

  // Read sizes for all segments except the first.  Include padding if necessary.
  KJ_STACK_ARRAY(_::WireValue<uint32_t>, moreSizes, segmentCount & ~1, 16, 64);
  if (segmentCount > 1) {
    inputStream.read(moreSizes.asBytes());
    for (uint i = 0; i < segmentCount - 1; i++) {
      totalWords += moreSizes[i].get();
    }
  }

  // Don't accept a message which the receiver couldn't possibly traverse without hitting the
  // traversal limit.  Without this check, a malicious client could transmit a very large segment
  // size to make the receiver allocate excessive space and possibly crash.
  KJ_REQUIRE(totalWords <= options.traversalLimitInWords,
             "Message is too large.  To increase the limit on the receiving end, see "
             "capnp::ReaderOptions.") {
    segmentCount = 1;
    segment0Size = kj::min(segment0Size, options.traversalLimitInWords);
    totalWords = segment0Size;
    break;
  }

  if (scratchSpace.size() < totalWords) {
    // TODO(perf):  Consider allocating each segment as a separate chunk to reduce memory
    //   fragmentation.
    ownedSpace = kj::heapArray<word>(totalWords);
    scratchSpace = ownedSpace;
  }

  segment0 = scratchSpace.first(segment0Size);

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);
    size_t offset = segment0Size;

    for (uint i = 0; i < segmentCount - 1; i++) {
      uint segmentSize = moreSizes[i].get();
      moreSegments[i] = scratchSpace.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  if (segmentCount == 1) {
    inputStream.read(scratchSpace.first(totalWords).asBytes());
  } else if (segmentCount > 1) {
    readPos = scratchSpace.asBytes().begin();
    readPos += inputStream.read(kj::arrayPtr(readPos, totalWords * sizeof(word)), segment0Size * sizeof(word));
  }
}